

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O1

unsigned_long __thiscall
jbcoin::STObject::getFieldByValue<jbcoin::STInteger<unsigned_long>,unsigned_long>
          (STObject *this,SField *field)

{
  int iVar1;
  long lVar2;
  unsigned_long uVar3;
  STBase *pSVar4;
  
  iVar1 = getFieldIndex(this,field);
  if (iVar1 == -1) {
    pSVar4 = (STBase *)0x0;
  }
  else {
    pSVar4 = (this->v_).
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar1].p_;
  }
  if (pSVar4 != (STBase *)0x0) {
    iVar1 = (*pSVar4->_vptr_STBase[4])(pSVar4);
    if (iVar1 == 0) {
      uVar3 = 0;
    }
    else {
      lVar2 = __dynamic_cast(pSVar4,&STBase::typeinfo,&STInteger<unsigned_long>::typeinfo,0);
      if (lVar2 == 0) {
        Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
      }
      uVar3 = *(unsigned_long *)(lVar2 + 0x10);
    }
    return uVar3;
  }
  Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
}

Assistant:

V getFieldByValue (SField const& field) const
    {
        const STBase* rf = peekAtPField (field);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        SerializedTypeID id = rf->getSType ();

        if (id == STI_NOTPRESENT)
            return V (); // optional field not present

        const T* cf = dynamic_cast<const T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        return cf->value ();
    }